

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

bool soul::containsChar(char *s,char c)

{
  char cVar1;
  
  if (s == (char *)0x0) {
    return false;
  }
  do {
    cVar1 = *s;
    if (cVar1 == c) {
      return cVar1 != '\0';
    }
    s = s + 1;
  } while (cVar1 != '\0');
  return cVar1 != '\0';
}

Assistant:

bool containsChar (const char* s, char c) noexcept
{
    if (s == nullptr)
        return false;

    for (; *s != 0; ++s)
        if (*s == c)
            return true;

    return false;
}